

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignedsuperblockheap.h
# Opt level: O3

void * __thiscall
Hoard::SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource>::malloc
          (SuperblockStore<262144UL,_HL::SpinLockType,_Hoard::MmapSource> *this,size_t __size)

{
  DLList *pDVar1;
  AlignedMmapInstance<262144UL> AVar2;
  Entry *pEVar3;
  AlignedMmapInstance<262144UL> *this_00;
  Entry *e;
  Entry *__addr;
  lock_guard<HL::SpinLockType> l;
  
  pDVar1 = &this->_freeSuperblocks;
  __addr = (this->_freeSuperblocks).head.next;
  if (__addr == &pDVar1->head) {
    if (HL::ExactlyOne<HL::LockedHeap<HL::SpinLockType,Hoard::AlignedMmapInstance<262144ul>>>::
        operator()()::theOneTrueInstancePtr == '\0') {
      SuperblockStore<262144ul,HL::SpinLockType,Hoard::MmapSource>::malloc();
    }
    this_00 = HL::ExactlyOne<HL::LockedHeap<HL::SpinLockType,Hoard::AlignedMmapInstance<262144ul>>>
              ::operator()()::theOneTrueInstancePtr;
    LOCK();
    AVar2 = *HL::ExactlyOne<HL::LockedHeap<HL::SpinLockType,Hoard::AlignedMmapInstance<262144ul>>>::
             operator()()::theOneTrueInstancePtr;
    *HL::ExactlyOne<HL::LockedHeap<HL::SpinLockType,Hoard::AlignedMmapInstance<262144ul>>>::
     operator()()::theOneTrueInstancePtr = (AlignedMmapInstance<262144UL>)0x1;
    UNLOCK();
    if (((byte)AVar2 & 1) != 0) {
      HL::SpinLockType::contendedLock((SpinLockType *)this_00);
    }
    __addr = (Entry *)mmap((void *)0x0,0x40000,3,0x22,-1,0);
    if (__addr == (Entry *)0xffffffffffffffff) {
      __addr = (Entry *)0x0;
    }
    if ((Entry *)((ulong)((long)&__addr[0x3fff].next + 7U) & 0xfffffffffffc0000) != __addr) {
      munmap(__addr,0x40000);
      __addr = (Entry *)AlignedMmapInstance<262144UL>::slowMap(this_00,0x40000);
    }
    LOCK();
    *this_00 = (AlignedMmapInstance<262144UL>)0x0;
    UNLOCK();
    if (__addr == (Entry *)0x0) {
      return (void *)0x0;
    }
    pEVar3 = (this->_freeSuperblocks).head.next;
    __addr->prev = &pDVar1->head;
    __addr->next = pEVar3;
    (this->_freeSuperblocks).head.next = __addr;
    pEVar3->prev = __addr;
  }
  if (__addr == &pDVar1->head) {
    return (void *)0x0;
  }
  pEVar3 = __addr->next;
  (this->_freeSuperblocks).head.next = pEVar3;
  pEVar3->prev = &pDVar1->head;
  return __addr;
}

Assistant:

void * malloc (size_t) {
      if (_freeSuperblocks.isEmpty()) {
	// Get more memory.
	void * ptr = _superblockSource.malloc (ChunksToGrab * SuperblockSize);
	if (!ptr) {
	  return nullptr;
	}
	char * p = (char *) ptr;
	for (int i = 0; i < ChunksToGrab; i++) {
	  _freeSuperblocks.insert ((DLList::Entry *) p);
	  p += SuperblockSize;
	}
      }
      return _freeSuperblocks.get();
    }